

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_shuffle.hpp
# Opt level: O0

void bcl::
     random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                first,__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      last,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *eng)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __b;
  difference_type n;
  uniform_real_distribution<double> dist;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> this;
  long local_30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_8;
  
  local_8._M_current = (uint *)in_RDI;
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)0x1015bd);
  for (local_30 = __gnu_cxx::operator-
                            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
      1 < local_30; local_30 = local_30 + -1) {
    __b._M_current = (uint *)(double)local_30;
    this._M_current = local_8._M_current;
    std::uniform_real_distribution<double>::operator()
              ((uniform_real_distribution<double> *)in_stack_ffffffffffffffc0._M_current,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)__b._M_current);
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
         ::operator+(this._M_current,in_stack_ffffffffffffffc0._M_current);
    std::
    iter_swap<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (in_stack_ffffffffffffffc0,__b);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_8);
  }
  return;
}

Assistant:

void random_shuffle(RandomAccessIter first, RandomAccessIter last,
                    ENGINE& eng) {
  std::uniform_real_distribution<> dist;
  using std::iter_swap;
  for (typename std::iterator_traits<RandomAccessIter>::difference_type
         n = last - first; n > 1; ++first, --n)
    iter_swap(first, first + (int)(n * dist(eng)));
}